

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inflate_adler32.cc
# Opt level: O2

void __thiscall inflate_adler32_Test::~inflate_adler32_Test(inflate_adler32_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(inflate, adler32) {
    unsigned char uncompressed[1024];
    PREFIX3(stream) strm;

    memset(&strm, 0, sizeof(strm));

    int err = PREFIX(inflateInit2)(&strm, 32 + MAX_WBITS);
    EXPECT_EQ(err, Z_OK);

    strm.next_in = compressed;
    strm.avail_in = sizeof(compressed);
    strm.next_out = uncompressed;
    strm.avail_out = sizeof(uncompressed);

    err = PREFIX(inflate)(&strm, Z_NO_FLUSH);
    EXPECT_EQ(err, Z_STREAM_END);

    EXPECT_EQ(strm.adler, 0x6b931030);

    err = PREFIX(inflateEnd)(&strm);
    EXPECT_EQ(err, Z_OK);

    EXPECT_TRUE(memcmp(uncompressed, original, MIN(strm.total_out, strlen(original))) == 0);
}